

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::
Span<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
::freeData(Span<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
           *this)

{
  MultiNodeChain<std::shared_ptr<const_QGradientCache::CacheInfo>_> *this_00;
  void *in_RSI;
  long lVar1;
  
  if (this->entries != (Entry *)0x0) {
    lVar1 = 0;
    do {
      if ((this->offsets[lVar1] != 0xff) &&
         (this_00 = *(MultiNodeChain<std::shared_ptr<const_QGradientCache::CacheInfo>_> **)
                     (this->entries[this->offsets[lVar1]].storage.data + 8),
         this_00 != (MultiNodeChain<std::shared_ptr<const_QGradientCache::CacheInfo>_> *)0x0)) {
        MultiNodeChain<std::shared_ptr<const_QGradientCache::CacheInfo>_>::free(this_00,in_RSI);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x80);
    if (this->entries != (Entry *)0x0) {
      operator_delete__(this->entries);
    }
    this->entries = (Entry *)0x0;
  }
  return;
}

Assistant:

void freeData() noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (entries) {
            if constexpr (!std::is_trivially_destructible<Node>::value) {
                for (auto o : offsets) {
                    if (o != SpanConstants::UnusedEntry)
                        entries[o].node().~Node();
                }
            }
            delete[] entries;
            entries = nullptr;
        }
    }